

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O3

void png_write_find_filter(png_structrp png_ptr,png_row_infop row_info)

{
  png_byte *ppVar1;
  ulong uVar2;
  int iVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  png_bytep tptr;
  ulong uVar7;
  ulong uVar8;
  png_const_bytep ppVar9;
  long lVar10;
  png_const_bytep input;
  ulong uVar11;
  png_bytep ppVar12;
  uint uVar13;
  png_byte *ppVar14;
  uint uVar15;
  png_const_bytep ppVar16;
  png_const_bytep ppVar17;
  byte *pbVar18;
  png_const_bytep ppVar19;
  png_bytep ppVar20;
  uint uVar21;
  byte *pbVar22;
  byte *pbVar23;
  uint uVar24;
  ulong uVar25;
  bool bVar26;
  png_bytep local_58;
  png_const_bytep local_48;
  
  bVar5 = png_ptr->do_filter;
  uVar2 = row_info->rowbytes;
  bVar6 = row_info->pixel_depth;
  ppVar9 = png_ptr->row_buf;
  if (uVar2 < 0x1ffffffffffffff) {
    uVar11 = 0xfffffffffffffeff;
    if (((bVar5 != 8 & bVar5 >> 3) == 1) && (uVar11 = 0, uVar2 != 0)) {
      uVar7 = 0;
      do {
        bVar4 = ppVar9[uVar7 + 1];
        uVar15 = 0x100 - bVar4;
        if (-1 < (char)bVar4) {
          uVar15 = (uint)bVar4;
        }
        uVar11 = uVar11 + uVar15;
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
    }
  }
  else {
    bVar5 = bVar5 & -bVar5;
    uVar11 = 0xfffffffffffffeff;
  }
  uVar15 = bVar6 + 7 >> 3;
  uVar7 = (ulong)uVar15;
  if (bVar5 == 0x10) {
    input = png_ptr->try_row;
    *input = '\x01';
    ppVar17 = input + 1;
    ppVar1 = ppVar9 + 1;
    uVar8 = uVar7;
    ppVar14 = ppVar1;
    if (bVar6 != 0) {
      do {
        *ppVar17 = *ppVar14;
        ppVar17 = ppVar17 + 1;
        ppVar14 = ppVar14 + 1;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    if (uVar7 < uVar2) {
      lVar10 = 0;
      do {
        ppVar17[lVar10] = ppVar14[lVar10] - ppVar1[lVar10];
        lVar10 = lVar10 + 1;
      } while (uVar2 - uVar7 != lVar10);
    }
  }
  else {
    input = ppVar9;
    if ((bVar5 & 0x10) != 0) {
      ppVar17 = png_ptr->try_row;
      *ppVar17 = '\x01';
      pbVar18 = ppVar17 + 1;
      pbVar23 = ppVar9 + 1;
      uVar25 = 0;
      uVar8 = uVar7;
      pbVar22 = pbVar23;
      if (bVar6 != 0) {
        do {
          bVar4 = *pbVar22;
          *pbVar18 = bVar4;
          uVar13 = 0x100 - bVar4;
          if (-1 < (char)bVar4) {
            uVar13 = (uint)bVar4;
          }
          uVar25 = uVar25 + uVar13;
          pbVar18 = pbVar18 + 1;
          pbVar22 = pbVar22 + 1;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      if (uVar7 < uVar2) {
        lVar10 = 0;
        do {
          bVar4 = pbVar22[lVar10] - pbVar23[lVar10];
          pbVar18[lVar10] = bVar4;
          uVar13 = 0x100 - bVar4;
          if (-1 < (char)bVar4) {
            uVar13 = (uint)bVar4;
          }
          uVar25 = uVar13 + uVar25;
        } while ((uVar25 <= uVar11) &&
                (uVar8 = uVar7 + 1 + lVar10, lVar10 = lVar10 + 1, uVar8 < uVar2));
      }
      if ((uVar25 < uVar11) &&
         (input = ppVar17, uVar11 = uVar25, png_ptr->tst_row != (png_bytep)0x0)) {
        png_ptr->try_row = png_ptr->tst_row;
        png_ptr->tst_row = ppVar17;
      }
    }
  }
  if (bVar5 == 0x20) {
    input = png_ptr->try_row;
    *input = '\x02';
    if (uVar2 == 0) goto LAB_00123892;
    ppVar20 = png_ptr->prev_row;
    uVar8 = 0;
    do {
      input[uVar8 + 1] = ppVar9[uVar8 + 1] - ppVar20[uVar8 + 1];
      uVar8 = uVar8 + 1;
    } while (uVar2 != uVar8);
  }
  else if ((bVar5 & 0x20) != 0) {
    ppVar17 = png_ptr->try_row;
    *ppVar17 = '\x02';
    if (uVar2 == 0) {
      uVar8 = 0;
    }
    else {
      ppVar20 = png_ptr->prev_row;
      uVar8 = 0;
      uVar25 = 1;
      do {
        bVar4 = ppVar9[uVar25] - ppVar20[uVar25];
        ppVar17[uVar25] = bVar4;
        uVar13 = 0x100 - bVar4;
        if (-1 < (char)bVar4) {
          uVar13 = (uint)bVar4;
        }
        uVar8 = uVar13 + uVar8;
      } while ((uVar8 <= uVar11) && (bVar26 = uVar2 != uVar25, uVar25 = uVar25 + 1, bVar26));
    }
    if ((uVar8 < uVar11) && (input = ppVar17, uVar11 = uVar8, png_ptr->tst_row != (png_bytep)0x0)) {
      png_ptr->try_row = png_ptr->tst_row;
      png_ptr->tst_row = ppVar17;
    }
  }
  if (bVar5 == 0x40) {
    input = png_ptr->try_row;
    *input = '\x03';
    ppVar17 = input + 1;
    pbVar18 = png_ptr->prev_row + 1;
    ppVar16 = ppVar9 + 1;
    uVar8 = uVar7;
    ppVar19 = ppVar16;
    if (bVar6 != 0) {
      do {
        *ppVar17 = *ppVar19 - (*pbVar18 >> 1);
        ppVar17 = ppVar17 + 1;
        pbVar18 = pbVar18 + 1;
        ppVar19 = ppVar19 + 1;
        uVar13 = (int)uVar8 - 1;
        uVar8 = (ulong)uVar13;
      } while (uVar13 != 0);
    }
    if (uVar7 < uVar2) {
      lVar10 = 0;
      do {
        ppVar17[lVar10] =
             ppVar19[lVar10] - (char)((uint)ppVar16[lVar10] + (uint)pbVar18[lVar10] >> 1);
        iVar3 = (int)lVar10;
        lVar10 = lVar10 + 1;
      } while (uVar15 + 1 + iVar3 < uVar2);
    }
  }
  else if ((bVar5 & 0x40) != 0) {
    ppVar16 = png_ptr->try_row;
    *ppVar16 = '\x03';
    pbVar18 = ppVar16 + 1;
    pbVar23 = png_ptr->prev_row + 1;
    ppVar17 = ppVar9 + 1;
    uVar25 = 0;
    ppVar19 = ppVar17;
    uVar8 = uVar7;
    if (bVar6 != 0) {
      do {
        bVar4 = *ppVar19 - (*pbVar23 >> 1);
        *pbVar18 = bVar4;
        uVar15 = 0x100 - bVar4;
        if (-1 < (char)bVar4) {
          uVar15 = (uint)bVar4;
        }
        uVar25 = uVar25 + uVar15;
        pbVar18 = pbVar18 + 1;
        pbVar23 = pbVar23 + 1;
        ppVar19 = ppVar19 + 1;
        uVar15 = (int)uVar8 - 1;
        uVar8 = (ulong)uVar15;
      } while (uVar15 != 0);
    }
    if (uVar7 < uVar2) {
      lVar10 = 0;
      do {
        bVar4 = ppVar19[lVar10] - (char)((uint)ppVar17[lVar10] + (uint)pbVar23[lVar10] >> 1);
        pbVar18[lVar10] = bVar4;
        uVar15 = 0x100 - bVar4;
        if (-1 < (char)bVar4) {
          uVar15 = (uint)bVar4;
        }
        uVar25 = uVar15 + uVar25;
      } while ((uVar25 <= uVar11) &&
              (iVar3 = (int)lVar10, lVar10 = lVar10 + 1, (bVar6 + 7 >> 3) + 1 + iVar3 < uVar2));
    }
    if ((uVar25 < uVar11) && (input = ppVar16, uVar11 = uVar25, png_ptr->tst_row != (png_bytep)0x0))
    {
      png_ptr->try_row = png_ptr->tst_row;
      png_ptr->tst_row = ppVar16;
    }
  }
  if (bVar5 == 0x80) {
    input = png_ptr->try_row;
    *input = '\x04';
    ppVar17 = input + 1;
    ppVar12 = png_ptr->prev_row + 1;
    ppVar9 = ppVar9 + 1;
    ppVar20 = ppVar12;
    ppVar16 = ppVar9;
    if (bVar6 != 0) {
      uVar11 = 0;
      do {
        ppVar17[uVar11] = ppVar9[uVar11] - ppVar12[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar7 != uVar11);
      ppVar17 = ppVar17 + uVar11;
      ppVar20 = ppVar12 + uVar11;
      ppVar16 = ppVar9 + uVar11;
    }
    if (uVar7 < uVar2) {
      lVar10 = 0;
      do {
        bVar5 = ppVar12[lVar10];
        uVar13 = (uint)ppVar20[lVar10] - (uint)bVar5;
        uVar21 = (uint)ppVar9[lVar10] - (uint)bVar5;
        uVar15 = -uVar13;
        if (0 < (int)uVar13) {
          uVar15 = uVar13;
        }
        uVar24 = -uVar21;
        if (0 < (int)uVar21) {
          uVar24 = uVar21;
        }
        uVar21 = uVar21 + uVar13;
        uVar13 = -uVar21;
        if (0 < (int)uVar21) {
          uVar13 = uVar21;
        }
        if ((uVar24 & 0xff) <= uVar13) {
          bVar5 = ppVar20[lVar10];
        }
        bVar6 = ppVar9[lVar10];
        if (uVar13 < (uVar15 & 0xff)) {
          bVar6 = bVar5;
        }
        if ((uVar24 & 0xff) < (uVar15 & 0xff)) {
          bVar6 = bVar5;
        }
        ppVar17[lVar10] = ppVar16[lVar10] - bVar6;
        lVar10 = lVar10 + 1;
      } while (uVar2 - uVar7 != lVar10);
    }
  }
  else if ((char)bVar5 < '\0') {
    ppVar16 = png_ptr->try_row;
    *ppVar16 = '\x04';
    ppVar17 = ppVar16 + 1;
    ppVar20 = png_ptr->prev_row + 1;
    ppVar9 = ppVar9 + 1;
    uVar8 = 0;
    local_58 = ppVar20;
    local_48 = ppVar9;
    if (bVar6 != 0) {
      uVar25 = 0;
      do {
        bVar5 = ppVar9[uVar25] - ppVar20[uVar25];
        uVar15 = 0x100 - bVar5;
        if (-1 < (char)bVar5) {
          uVar15 = (uint)bVar5;
        }
        ppVar17[uVar25] = bVar5;
        uVar8 = uVar8 + uVar15;
        uVar25 = uVar25 + 1;
      } while (uVar7 != uVar25);
      ppVar17 = ppVar17 + uVar25;
      local_58 = ppVar20 + uVar25;
      local_48 = ppVar9 + uVar25;
    }
    if (uVar7 < uVar2) {
      lVar10 = 0;
      do {
        bVar5 = ppVar20[lVar10];
        uVar13 = (uint)local_58[lVar10] - (uint)bVar5;
        uVar21 = (uint)ppVar9[lVar10] - (uint)bVar5;
        uVar15 = -uVar13;
        if (0 < (int)uVar13) {
          uVar15 = uVar13;
        }
        uVar24 = -uVar21;
        if (0 < (int)uVar21) {
          uVar24 = uVar21;
        }
        uVar21 = uVar21 + uVar13;
        uVar13 = -uVar21;
        if (0 < (int)uVar21) {
          uVar13 = uVar21;
        }
        if ((uVar24 & 0xff) <= uVar13) {
          bVar5 = local_58[lVar10];
        }
        bVar6 = ppVar9[lVar10];
        if (uVar13 < (uVar15 & 0xff)) {
          bVar6 = bVar5;
        }
        if ((uVar24 & 0xff) < (uVar15 & 0xff)) {
          bVar6 = bVar5;
        }
        bVar6 = local_48[lVar10] - bVar6;
        ppVar17[lVar10] = bVar6;
        uVar15 = 0x100 - bVar6;
        if (-1 < (char)bVar6) {
          uVar15 = (uint)bVar6;
        }
        uVar8 = uVar8 + uVar15;
      } while ((uVar8 <= uVar11) &&
              (uVar25 = uVar7 + 1 + lVar10, lVar10 = lVar10 + 1, uVar25 < uVar2));
    }
    if ((uVar8 < uVar11) && (input = ppVar16, png_ptr->tst_row != (png_bytep)0x0)) {
      png_ptr->try_row = png_ptr->tst_row;
      png_ptr->tst_row = ppVar16;
    }
  }
LAB_00123892:
  png_compress_IDAT(png_ptr,input,row_info->rowbytes + 1,0);
  ppVar20 = png_ptr->prev_row;
  if (ppVar20 != (png_bytep)0x0) {
    png_ptr->prev_row = png_ptr->row_buf;
    png_ptr->row_buf = ppVar20;
  }
  png_write_finish_row(png_ptr);
  uVar15 = png_ptr->flush_rows + 1;
  png_ptr->flush_rows = uVar15;
  if (uVar15 <= png_ptr->flush_dist - 1) {
    return;
  }
  png_write_flush(png_ptr);
  return;
}

Assistant:

void /* PRIVATE */
png_write_find_filter(png_structrp png_ptr, png_row_infop row_info)
{
#ifndef PNG_WRITE_FILTER_SUPPORTED
   png_write_filtered_row(png_ptr, png_ptr->row_buf, row_info->rowbytes+1);
#else
   unsigned int filter_to_do = png_ptr->do_filter;
   png_bytep row_buf;
   png_bytep best_row;
   png_uint_32 bpp;
   size_t mins;
   size_t row_bytes = row_info->rowbytes;

   png_debug(1, "in png_write_find_filter");

   /* Find out how many bytes offset each pixel is */
   bpp = (row_info->pixel_depth + 7) >> 3;

   row_buf = png_ptr->row_buf;
   mins = PNG_SIZE_MAX - 256/* so we can detect potential overflow of the
                               running sum */;

   /* The prediction method we use is to find which method provides the
    * smallest value when summing the absolute values of the distances
    * from zero, using anything >= 128 as negative numbers.  This is known
    * as the "minimum sum of absolute differences" heuristic.  Other
    * heuristics are the "weighted minimum sum of absolute differences"
    * (experimental and can in theory improve compression), and the "zlib
    * predictive" method (not implemented yet), which does test compressions
    * of lines using different filter methods, and then chooses the
    * (series of) filter(s) that give minimum compressed data size (VERY
    * computationally expensive).
    *
    * GRR 980525:  consider also
    *
    *   (1) minimum sum of absolute differences from running average (i.e.,
    *       keep running sum of non-absolute differences & count of bytes)
    *       [track dispersion, too?  restart average if dispersion too large?]
    *
    *  (1b) minimum sum of absolute differences from sliding average, probably
    *       with window size <= deflate window (usually 32K)
    *
    *   (2) minimum sum of squared differences from zero or running average
    *       (i.e., ~ root-mean-square approach)
    */


   /* We don't need to test the 'no filter' case if this is the only filter
    * that has been chosen, as it doesn't actually do anything to the data.
    */
   best_row = png_ptr->row_buf;

   if (PNG_SIZE_MAX/128 <= row_bytes)
   {
      /* Overflow can occur in the calculation, just select the lowest set
       * filter.
       */
      filter_to_do &= 0U-filter_to_do;
   }
   else if ((filter_to_do & PNG_FILTER_NONE) != 0 &&
         filter_to_do != PNG_FILTER_NONE)
   {
      /* Overflow not possible and multiple filters in the list, including the
       * 'none' filter.
       */
      png_bytep rp;
      size_t sum = 0;
      size_t i;
      unsigned int v;

      {
         for (i = 0, rp = row_buf + 1; i < row_bytes; i++, rp++)
         {
            v = *rp;
#ifdef PNG_USE_ABS
            sum += 128 - abs((int)v - 128);
#else
            sum += (v < 128) ? v : 256 - v;
#endif
         }
      }

      mins = sum;
   }

   /* Sub filter */
   if (filter_to_do == PNG_FILTER_SUB)
   /* It's the only filter so no testing is needed */
   {
      png_setup_sub_row_only(png_ptr, bpp, row_bytes);
      best_row = png_ptr->try_row;
   }

   else if ((filter_to_do & PNG_FILTER_SUB) != 0)
   {
      size_t sum;
      size_t lmins = mins;

      sum = png_setup_sub_row(png_ptr, bpp, row_bytes, lmins);

      if (sum < mins)
      {
         mins = sum;
         best_row = png_ptr->try_row;
         if (png_ptr->tst_row != NULL)
         {
            png_ptr->try_row = png_ptr->tst_row;
            png_ptr->tst_row = best_row;
         }
      }
   }

   /* Up filter */
   if (filter_to_do == PNG_FILTER_UP)
   {
      png_setup_up_row_only(png_ptr, row_bytes);
      best_row = png_ptr->try_row;
   }

   else if ((filter_to_do & PNG_FILTER_UP) != 0)
   {
      size_t sum;
      size_t lmins = mins;

      sum = png_setup_up_row(png_ptr, row_bytes, lmins);

      if (sum < mins)
      {
         mins = sum;
         best_row = png_ptr->try_row;
         if (png_ptr->tst_row != NULL)
         {
            png_ptr->try_row = png_ptr->tst_row;
            png_ptr->tst_row = best_row;
         }
      }
   }

   /* Avg filter */
   if (filter_to_do == PNG_FILTER_AVG)
   {
      png_setup_avg_row_only(png_ptr, bpp, row_bytes);
      best_row = png_ptr->try_row;
   }

   else if ((filter_to_do & PNG_FILTER_AVG) != 0)
   {
      size_t sum;
      size_t lmins = mins;

      sum= png_setup_avg_row(png_ptr, bpp, row_bytes, lmins);

      if (sum < mins)
      {
         mins = sum;
         best_row = png_ptr->try_row;
         if (png_ptr->tst_row != NULL)
         {
            png_ptr->try_row = png_ptr->tst_row;
            png_ptr->tst_row = best_row;
         }
      }
   }

   /* Paeth filter */
   if (filter_to_do == PNG_FILTER_PAETH)
   {
      png_setup_paeth_row_only(png_ptr, bpp, row_bytes);
      best_row = png_ptr->try_row;
   }

   else if ((filter_to_do & PNG_FILTER_PAETH) != 0)
   {
      size_t sum;
      size_t lmins = mins;

      sum = png_setup_paeth_row(png_ptr, bpp, row_bytes, lmins);

      if (sum < mins)
      {
         best_row = png_ptr->try_row;
         if (png_ptr->tst_row != NULL)
         {
            png_ptr->try_row = png_ptr->tst_row;
            png_ptr->tst_row = best_row;
         }
      }
   }

   /* Do the actual writing of the filtered row data from the chosen filter. */
   png_write_filtered_row(png_ptr, best_row, row_info->rowbytes+1);

#endif /* WRITE_FILTER */
}